

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O0

void bench_field_half(void *arg,int iters)

{
  int in_ESI;
  long in_RDI;
  bench_inv *data;
  int i;
  undefined4 local_10;
  
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    secp256k1_fe_impl_half((secp256k1_fe *)(in_RDI + 0x40));
  }
  return;
}

Assistant:

static void bench_field_half(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        secp256k1_fe_half(&data->fe[0]);
    }
}